

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.hpp
# Opt level: O2

string * __thiscall
duckdb::StringUtil::
Format<std::__cxx11::string,std::__cxx11::string,char_const*,std::__cxx11::string>
          (string *__return_storage_ptr__,StringUtil *this,string *fmt_str,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_1,char *params_2
          ,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_3)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  ::std::__cxx11::string::string((string *)&local_48,(string *)fmt_str);
  ::std::__cxx11::string::string((string *)&local_68,(string *)params);
  ::std::__cxx11::string::string((string *)&stack0xffffffffffffff78,(string *)params_2);
  Exception::
  ConstructMessage<std::__cxx11::string,std::__cxx11::string,char_const*,std::__cxx11::string>
            (__return_storage_ptr__,(Exception *)this,&local_48,&local_68,params_1,
             &stack0xffffffffffffff78,in_stack_ffffffffffffff78);
  ::std::__cxx11::string::~string((string *)&stack0xffffffffffffff78);
  ::std::__cxx11::string::~string((string *)&local_68);
  ::std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

static string Format(const string fmt_str, ARGS... params) {
		return Exception::ConstructMessage(fmt_str, params...);
	}